

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

void __thiscall
pbrt::PerspectiveCamera::PDF_We(PerspectiveCamera *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  Float FVar1;
  Float FVar2;
  Float FVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined4 uVar6;
  float fVar7;
  undefined8 uVar8;
  bool bVar9;
  float fVar10;
  undefined1 auVar14 [56];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  float n2;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar21 [60];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar22 [56];
  undefined1 auVar20 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Bounds2f BVar25;
  Vector3f VVar26;
  Point3f PVar27;
  int local_80;
  float va;
  Tuple3<pbrt::Vector3,_float> local_78;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  
  auVar21 = in_ZMM1._4_60_;
  local_78.x = 0.0;
  local_78.y = 0.0;
  local_78.z = 1.0;
  auVar14 = (undefined1  [56])0x0;
  VVar26 = AnimatedTransform::operator()((AnimatedTransform *)this,(Vector3f *)&local_78,ray->time);
  auVar18._0_4_ = VVar26.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar18._4_60_ = auVar21;
  auVar11._0_8_ = VVar26.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar11._8_56_ = auVar14;
  uVar5._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar5._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = uVar5;
  auVar24._0_4_ = (float)(undefined4)uVar5 * VVar26.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar24._4_4_ = (float)uVar5._4_4_ * VVar26.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar24._8_4_ = auVar14._0_4_ * 0.0;
  auVar24._12_4_ = auVar14._4_4_ * 0.0;
  auVar24 = vmovshdup_avx(auVar24);
  auVar24 = vfmadd231ss_fma(auVar24,auVar23,auVar11._0_16_);
  fVar10 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  local_68 = vfmadd231ss_fma(auVar24,ZEXT416((uint)fVar10),auVar18._0_16_);
  if (this->cosTotalWidth < local_68._0_4_) {
    auVar16._0_12_ = ZEXT412(0);
    auVar16._12_4_ = 0;
    uVar8 = vcmpss_avx512f(auVar16,ZEXT416((uint)(this->super_ProjectiveCamera).lensRadius),1);
    bVar9 = (bool)((byte)uVar8 & 1);
    fVar15 = (float)((uint)bVar9 * (int)(this->super_ProjectiveCamera).focalDistance +
                    (uint)!bVar9 * 0x3f800000) / local_68._0_4_;
    uVar4 = (ray->o).super_Tuple3<pbrt::Point3,_float>.x;
    uVar6 = (ray->o).super_Tuple3<pbrt::Point3,_float>.y;
    local_78.z = fVar10 * fVar15 + (ray->o).super_Tuple3<pbrt::Point3,_float>.z;
    auVar17._0_4_ = (float)(undefined4)uVar5 * fVar15 + (float)uVar4;
    auVar17._4_4_ = (float)uVar5._4_4_ * fVar15 + (float)uVar6;
    auVar17._8_4_ = fVar15 * 0.0 + 0.0;
    auVar17._12_4_ = fVar15 * 0.0 + 0.0;
    auVar21 = ZEXT1260(auVar17._4_12_);
    local_78._0_8_ = vmovlps_avx(auVar17);
    auVar14 = (undefined1  [56])0x0;
    PVar27 = AnimatedTransform::ApplyInverse
                       ((AnimatedTransform *)this,(Point3f *)&local_78,ray->time);
    auVar19._0_4_ = PVar27.super_Tuple3<pbrt::Point3,_float>.z;
    auVar19._4_60_ = auVar21;
    auVar12._0_8_ = PVar27.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar12._8_56_ = auVar14;
    FVar1 = (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1][0];
    local_48 = auVar12._0_16_;
    local_58 = vmovshdup_avx(local_48);
    auVar24 = vfmadd213ss_fma(ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [3][2]),auVar19._0_16_,
                              ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [3][3]));
    fVar10 = (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1][1];
    FVar2 = (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1][2];
    FVar3 = (this->super_ProjectiveCamera).cameraFromRaster.mInv.m[1][3];
    auVar23 = vfmadd231ss_fma(ZEXT416((uint)(local_58._0_4_ *
                                            (this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [3][1])),local_48,
                              ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [3][0]));
    local_80 = 0;
    fVar15 = auVar23._0_4_ + auVar24._0_4_;
    va = fVar15;
    if ((fVar15 == 0.0) && (!NAN(fVar15))) {
      LogFatal<char_const(&)[3],char_const(&)[2],char_const(&)[3],float&,char_const(&)[2],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/transform.h"
                 ,0x17a,"Check failed: %s != %s with %s = %s, %s = %s",(char (*) [3])"wp",
                 (char (*) [2])0x2925374,(char (*) [3])"wp",&va,(char (*) [2])0x2925374,&local_80);
    }
    auVar24 = vfmadd213ss_fma(ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [0][2]),auVar19._0_16_,
                              ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [0][3]));
    bVar9 = fVar15 == 1.0;
    auVar23 = vfmadd213ss_fma(ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [0][0]),local_48,
                              ZEXT416((uint)(local_58._0_4_ *
                                            (this->super_ProjectiveCamera).cameraFromRaster.mInv.m
                                            [0][1])));
    fVar7 = auVar23._0_4_ + auVar24._0_4_;
    auVar14 = (undefined1  [56])0x0;
    local_38 = ZEXT416((uint)bVar9 * (int)fVar7 + (uint)!bVar9 * (int)(fVar7 / fVar15));
    auVar22 = ZEXT856(0);
    BVar25 = FilmBase::SampleBounds
                       ((FilmBase *)
                        ((this->super_ProjectiveCamera).super_CameraBase.film.
                         super_TaggedPointer<pbrt::RGBFilm,_pbrt::GBufferFilm>.bits & 0xffffffffffff
                        ));
    auVar20._0_8_ = BVar25.pMax.super_Tuple2<pbrt::Point2,_float>;
    auVar20._8_56_ = auVar22;
    auVar13._0_8_ = BVar25.pMin.super_Tuple2<pbrt::Point2,_float>;
    auVar13._8_56_ = auVar14;
    if ((BVar25.pMin.super_Tuple2<pbrt::Point2,_float>.x <= (float)local_38._0_4_) &&
       ((float)local_38._0_4_ <= BVar25.pMax.super_Tuple2<pbrt::Point2,_float>.x)) {
      auVar24 = vfmadd132ss_fma(ZEXT416((uint)FVar1),ZEXT416((uint)(fVar10 * (float)local_58._0_4_))
                                ,ZEXT416((uint)local_48._0_4_));
      auVar23 = vfmadd132ss_fma(ZEXT416((uint)auVar19._0_4_),ZEXT416((uint)FVar3),
                                ZEXT416((uint)FVar2));
      fVar10 = auVar24._0_4_ + auVar23._0_4_;
      fVar10 = (float)((uint)bVar9 * (int)fVar10 + (uint)!bVar9 * (int)(fVar10 / fVar15));
      auVar24 = vmovshdup_avx(auVar13._0_16_);
      if ((auVar24._0_4_ <= fVar10) &&
         (auVar24 = vmovshdup_avx(auVar20._0_16_), fVar10 <= auVar24._0_4_)) {
        fVar10 = (this->super_ProjectiveCamera).lensRadius;
        uVar8 = vcmpss_avx512f(ZEXT416((uint)fVar10),ZEXT816(0),4);
        bVar9 = (bool)((byte)uVar8 & 1);
        *pdfPos = (Float)((uint)bVar9 * (int)(1.0 / (fVar10 * fVar10 * 3.1415927)) +
                         (uint)!bVar9 * 0x3f800000);
        *pdfDir = 1.0 / ((float)local_68._0_4_ * (float)local_68._0_4_ * (float)local_68._0_4_ *
                        this->A);
        return;
      }
    }
  }
  *pdfDir = 0.0;
  *pdfPos = 0.0;
  return;
}

Assistant:

void PerspectiveCamera::PDF_We(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    // Return zero PDF values if ray direction is not front-facing
    Float cosTheta = Dot(ray.d, RenderFromCamera(Vector3f(0, 0, 1), ray.time));
    if (cosTheta <= cosTotalWidth) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Map ray $(\p{}, \w{})$ onto the raster grid
    Point3f pFocus = ray((lensRadius > 0 ? focalDistance : 1) / cosTheta);
    Point3f pCamera = CameraFromRender(pFocus, ray.time);
    Point3f pRaster = cameraFromRaster.ApplyInverse(pCamera);

    // Return zero probability for out of bounds points
    Bounds2f sampleBounds = film.SampleBounds();
    if (!Inside(Point2f(pRaster.x, pRaster.y), sampleBounds)) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    // Compute lens area  and return perspective camera probabilities
    Float lensArea = lensRadius != 0 ? (Pi * lensRadius * lensRadius) : 1;
    *pdfPos = 1 / lensArea;
    *pdfDir = 1 / (A * Pow<3>(cosTheta));
}